

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

SceneObject * __thiscall
CGL::Application::init_sphere(Application *this,SphereInfo *sphere,Matrix4x4 *transform)

{
  Sphere *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_a8;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_88;
  Vector3D local_68;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_48;
  
  local_a8.field_0.z = 0.0;
  local_a8.field_0.x = 0.0;
  local_a8.field_0.y = 0.0;
  local_a8.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_a8.field_0);
  Vector4D::projectTo3D((Vector4D *)&local_88.field_0);
  local_48.field_0.x = 1.0;
  local_48.field_0.y = 0.0;
  local_48.field_0.z = 0.0;
  local_48.field_0.w = 0.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_48.field_0);
  Vector4D::to3D((Vector4D *)&local_a8.field_0);
  auVar2 = vdppd_avx((undefined1  [16])local_88.field_2.xy,local_88._0_16_,0x31);
  dVar1 = local_88.field_0.z * local_88.field_0.z + auVar2._0_8_;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar1;
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar1 = auVar2._0_8_;
  }
  this_00 = (Sphere *)operator_new(0x40);
  GLScene::Sphere::Sphere(this_00,sphere,&local_68,dVar1);
  return &this_00->super_SceneObject;
}

Assistant:

GLScene::SceneObject *Application::init_sphere(
    SphereInfo& sphere, const Matrix4x4& transform) {
  const Vector3D& position = (transform * Vector4D(0, 0, 0, 1)).projectTo3D();
  double scale = (transform * Vector4D(1, 0, 0, 0)).to3D().norm();
  return new GLScene::Sphere(sphere, position, scale);
}